

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_writer.c
# Opt level: O0

int count_primitive_subexpfin(uint16_t n,uint16_t k,uint16_t v)

{
  int iVar1;
  ushort in_DX;
  ushort in_SI;
  ushort in_DI;
  int t;
  int a;
  int b;
  int mk;
  int i;
  int count;
  uint local_24;
  uint in_stack_ffffffffffffffe0;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = 0;
  local_10 = 0;
  local_14 = 0;
  while( true ) {
    if (local_10 == 0) {
      local_24 = (uint)in_SI;
    }
    else {
      local_24 = ((uint)in_SI + local_10) - 1;
    }
    iVar1 = 1 << ((byte)local_24 & 0x1f);
    if ((int)(uint)in_DI <= local_14 + iVar1 * 3) break;
    in_stack_ffffffffffffffe0 = (uint)(local_14 + iVar1 <= (int)(uint)in_DX);
    local_c = local_c + 1;
    if (in_stack_ffffffffffffffe0 == 0) {
      return local_24 + local_c;
    }
    local_10 = local_10 + 1;
    local_14 = iVar1 + local_14;
  }
  iVar1 = count_primitive_quniform
                    ((uint16_t)(in_stack_ffffffffffffffe0 >> 0x10),
                     (uint16_t)in_stack_ffffffffffffffe0);
  return iVar1 + local_c;
}

Assistant:

static int count_primitive_subexpfin(uint16_t n, uint16_t k, uint16_t v) {
  int count = 0;
  int i = 0;
  int mk = 0;
  while (1) {
    int b = (i ? k + i - 1 : k);
    int a = (1 << b);
    if (n <= mk + 3 * a) {
      count += count_primitive_quniform(n - mk, v - mk);
      break;
    } else {
      int t = (v >= mk + a);
      count++;
      if (t) {
        i = i + 1;
        mk += a;
      } else {
        count += b;
        break;
      }
    }
  }
  return count;
}